

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_worker.h
# Opt level: O0

void __thiscall chain_of_responsibility::FirstWorker::FirstWorker(FirstWorker *this)

{
  FirstWorker *this_local;
  
  IWorker::IWorker(&this->super_IWorker);
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR_HandlerRequest_0019e968;
  std::__cxx11::string::operator=((string *)&(this->super_IWorker).name_,"first worker");
  return;
}

Assistant:

FirstWorker::FirstWorker(/* args */) {
    name_ = "first worker";
}